

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O0

coda_mem_special *
coda_mem_time_new(coda_type_special *definition,coda_dynamic_type *attributes,
                 coda_dynamic_type *base_type)

{
  int iVar1;
  coda_mem_special *type;
  coda_dynamic_type *base_type_local;
  coda_dynamic_type *attributes_local;
  coda_type_special *definition_local;
  
  if (definition == (coda_type_special *)0x0) {
    coda_set_error(-100,"definition argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x3be);
    definition_local = (coda_type_special *)0x0;
  }
  else if (definition->type_class == coda_special_class) {
    if (definition->special_type == coda_special_time) {
      if (definition->base_type == base_type->definition) {
        definition_local = (coda_type_special *)malloc(0x28);
        if (definition_local == (coda_type_special *)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x28,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                         ,0x3d6);
          definition_local = (coda_type_special *)0x0;
        }
        else {
          definition_local->format = coda_backend_memory;
          *(coda_type_special **)&definition_local->type_class = definition;
          definition->retain_count = definition->retain_count + 1;
          *(mem_type_tag *)&definition_local->name = tag_mem_special;
          definition_local->description = (char *)attributes;
          definition_local->bit_size = (int64_t)base_type;
          if (((coda_dynamic_type *)definition_local->description == (coda_dynamic_type *)0x0) &&
             (iVar1 = create_attributes_record((coda_mem_type *)definition_local), iVar1 != 0)) {
            coda_mem_type_delete((coda_dynamic_type *)definition_local);
            definition_local = (coda_type_special *)0x0;
          }
        }
      }
      else {
        coda_set_error(-100,
                       "definition of base type should be the same as base type of definition (%s:%u)"
                       ,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                       ,0x3ce);
        definition_local = (coda_type_special *)0x0;
      }
    }
    else {
      coda_set_error(-100,"definition is not a time type (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                     ,0x3c8);
      definition_local = (coda_type_special *)0x0;
    }
  }
  else {
    coda_set_error(-100,"definition is not a special type (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x3c3);
    definition_local = (coda_type_special *)0x0;
  }
  return (coda_mem_special *)definition_local;
}

Assistant:

coda_mem_special *coda_mem_time_new(coda_type_special *definition, coda_dynamic_type *attributes,
                                    coda_dynamic_type *base_type)
{
    coda_mem_special *type;

    if (definition == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "definition argument is NULL (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }
    if (definition->type_class != coda_special_class)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "definition is not a special type (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }
    if (((coda_type_special *)definition)->special_type != coda_special_time)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "definition is not a time type (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }
    if (((coda_type_special *)definition)->base_type != base_type->definition)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "definition of base type should be the same as base type of "
                       "definition (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }

    type = (coda_mem_special *)malloc(sizeof(coda_mem_special));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_mem_special), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_memory;
    type->definition = definition;
    definition->retain_count++;
    type->tag = tag_mem_special;
    type->attributes = attributes;
    type->base_type = base_type;

    if (type->attributes == NULL)
    {
        if (create_attributes_record((coda_mem_type *)type) != 0)
        {
            coda_mem_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
    }

    return type;
}